

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void opengv::absolute_pose::modules::p3p_gao_main
               (bearingVectors_t *f,points_t *points,transformations_t *solutions)

{
  value_type vVar1;
  double dVar2;
  double dVar3;
  RealScalar RVar4;
  RealScalar RVar5;
  Scalar *pSVar6;
  reference pvVar7;
  Scalar *pSVar8;
  points_t *p2;
  StorageBaseType *matrix;
  value_type *__x;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_RSI;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_RDI;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  __type _Var12;
  pointer p1;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  transformation_t solution;
  points_t p_cam;
  int i_2;
  Matrix<double,_4,_1,_0,_4,_1> Y;
  Matrix<double,_4,_1,_0,_4,_1> X;
  Matrix<double,_4,_1,_0,_4,_1> Z;
  Matrix<double,_4,_1,_0,_4,_1> v;
  Matrix<double,_4,_1,_0,_4,_1> tempXY;
  Matrix<double,_4,_1,_0,_4,_1> tempYP2;
  Matrix<double,_4,_1,_0,_4,_1> y;
  Matrix<double,_4,_1,_0,_4,_1> b1;
  Matrix<double,_4,_1,_0,_4,_1> b1_part2;
  Matrix<double,_4,_1,_0,_4,_1> b1_part1;
  size_t i_1;
  Matrix<double,_4,_1,_0,_4,_1> ones;
  Matrix<double,_4,_1,_0,_4,_1> tempXP3;
  Matrix<double,_4,_1,_0,_4,_1> tempXP2;
  double rCb;
  double b0;
  double temp;
  size_t i;
  Matrix<double,_4,_1,_0,_4,_1> x;
  vector<double,_std::allocator<double>_> x_temp;
  Matrix<double,_5,_1,_0,_5,_1> factors;
  double rSq;
  double qSq;
  double pSq;
  double bSq;
  double aSq;
  double r;
  double q;
  double p;
  double b;
  double a;
  double cosgamma;
  double cosbeta;
  double cosalpha;
  bearingVector_t f3;
  bearingVector_t f2;
  bearingVector_t f1;
  double AC;
  double BC;
  double AB;
  Vector3d tempp;
  point_t C;
  point_t B;
  point_t A;
  undefined4 in_stack_ffffffffffffefe0;
  int in_stack_ffffffffffffefe4;
  DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *in_stack_ffffffffffffefe8;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_ffffffffffffeff8;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff008;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff010;
  dense_product_base<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
  *in_stack_fffffffffffff018;
  Scalar SVar160;
  StorageBaseType *in_stack_fffffffffffff028;
  MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *in_stack_fffffffffffff030;
  double *scalar;
  int local_984;
  MatrixXd *in_stack_fffffffffffff800;
  ulong local_328;
  ulong local_2a8;
  vector<double,_std::allocator<double>_> local_240 [2];
  double local_200;
  double local_1f8;
  double local_1f0;
  double local_1e8;
  double local_1e0;
  double local_1d8;
  double local_1d0;
  double local_1c8;
  double local_1c0;
  double local_1b8;
  non_const_type local_1b0;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  local_1a8;
  Scalar local_198;
  non_const_type local_190;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  local_188;
  Scalar local_178;
  non_const_type local_170;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  local_168;
  Scalar local_158;
  RealScalar local_108;
  RealScalar local_e8;
  RealScalar local_c8;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *local_40;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *local_38;
  
  local_40 = in_RSI;
  local_38 = in_RDI;
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::operator[](in_RSI,0);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffffefe8,
             (Matrix<double,_3,_1,_0,_3,_1> *)
             CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::operator[](local_40,1);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffffefe8,
             (Matrix<double,_3,_1,_0,_3,_1> *)
             CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::operator[](local_40,2);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffffefe8,
             (Matrix<double,_3,_1,_0,_3,_1> *)
             CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x7c4b19);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_stack_fffffffffffff010,in_stack_fffffffffffff008);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffffefe8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
  local_c8 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                       ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                        CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_stack_fffffffffffff010,in_stack_fffffffffffff008);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffffefe8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
  local_e8 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                       ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                        CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_stack_fffffffffffff010,in_stack_fffffffffffff008);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffffefe8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
  local_108 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                        ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::operator[](local_38,0);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffffefe8,
             (Matrix<double,_3,_1,_0,_3,_1> *)
             CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::operator[](local_38,1);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffffefe8,
             (Matrix<double,_3,_1,_0,_3,_1> *)
             CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::operator[](local_38,2);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffffefe8,
             (Matrix<double,_3,_1,_0,_3,_1> *)
             CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
  local_170 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
  local_168 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>::operator*
                        ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
                         in_stack_ffffffffffffefe8,
                         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
  local_158 = Eigen::internal::dense_product_base::operator_cast_to_double
                        (in_stack_fffffffffffff018);
  local_190 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
  local_188 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>::operator*
                        ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
                         in_stack_ffffffffffffefe8,
                         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
  local_178 = Eigen::internal::dense_product_base::operator_cast_to_double
                        (in_stack_fffffffffffff018);
  local_1b0 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
  local_1a8 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>::operator*
                        ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
                         in_stack_ffffffffffffefe8,
                         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
  local_198 = Eigen::internal::dense_product_base::operator_cast_to_double
                        (in_stack_fffffffffffff018);
  local_1b8 = std::pow<double,int>((double)in_stack_ffffffffffffefe8,in_stack_ffffffffffffefe4);
  local_1c0 = std::pow<double,int>((double)in_stack_ffffffffffffefe8,in_stack_ffffffffffffefe4);
  local_1c8 = local_158 * 2.0;
  local_1d0 = local_178 * 2.0;
  local_1d8 = local_198 * 2.0;
  local_1e0 = local_1b8 * local_1b8;
  local_1e8 = local_1c0 * local_1c0;
  local_1f0 = local_1c8 * local_1c8;
  local_1f8 = local_1d0 * local_1d0;
  local_200 = local_1d8 * local_1d8;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_1d8;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = -(local_1c8 * local_1d0);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_1f0 + local_1f8 + local_200;
  auVar9 = vfmadd213sd_fma(auVar9,auVar10,auVar11);
  dVar13 = auVar9._0_8_ - 1.0;
  if ((dVar13 != 0.0) || (NAN(dVar13))) {
    Eigen::Matrix<double,_5,_1,_0,_5,_1>::Matrix((Matrix<double,_5,_1,_0,_5,_1> *)0x7c4ee1);
    auVar38._8_8_ = 0;
    auVar38._0_8_ = local_1c0;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = local_1e8;
    auVar9 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar38,auVar58);
    auVar39._8_8_ = 0;
    auVar39._0_8_ = local_1b8;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = -(local_1c0 * local_200);
    auVar59._8_8_ = 0;
    auVar59._0_8_ = auVar9._0_8_ + local_1e0 + 1.0;
    auVar9 = vfmadd213sd_fma(auVar39,auVar14,auVar59);
    auVar60._8_8_ = 0;
    auVar60._0_8_ = local_1b8;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_1c0 * 2.0;
    auVar9 = vfmadd213sd_fma(auVar60,auVar15,auVar9);
    auVar40._8_8_ = 0;
    auVar40._0_8_ = local_1b8;
    auVar9 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar40,auVar9);
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1> *)
                        in_stack_ffffffffffffefe8,
                        CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
    *pSVar6 = auVar9._0_8_;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1> *)
                        in_stack_ffffffffffffefe8,
                        CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
    if ((*pSVar6 != 0.0) || (NAN(*pSVar6))) {
      auVar116._8_8_ = 0;
      auVar116._0_8_ = local_1d0;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = local_1b8;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_1c0 * -2.0 * local_1d0;
      auVar78._8_8_ = 0;
      auVar78._0_8_ = (local_1e0 + local_1e0) * local_1d0;
      auVar9 = vfmsub213sd_fma(auVar61,auVar16,auVar78);
      auVar79._8_8_ = 0;
      auVar79._0_8_ = local_1c0 * local_200 * local_1d0;
      auVar9 = vfmadd213sd_fma(auVar61,auVar79,auVar9);
      auVar9 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar116,auVar9);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_1c0 + local_1c0;
      auVar9 = vfmadd213sd_fma(auVar116,auVar17,auVar9);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_1b8 * 4.0;
      auVar9 = vfmadd213sd_fma(auVar116,auVar18,auVar9);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_1c8;
      auVar80._8_8_ = 0;
      auVar80._0_8_ = local_1d8;
      auVar107._8_8_ = 0;
      auVar107._0_8_ = local_1c8 * local_1c0;
      auVar9 = vfmadd213sd_fma(auVar80,auVar107,auVar9);
      auVar41._8_8_ = 0;
      auVar41._0_8_ = local_1c0 * local_1d8 * local_1c8;
      auVar9 = vfmadd213sd_fma(auVar61,auVar41,auVar9);
      auVar42._8_8_ = 0;
      auVar42._0_8_ = local_1e8 * local_1d8;
      auVar9 = vfnmadd213sd_fma(auVar19,auVar42,auVar9);
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1> *)
                          in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      *pSVar6 = auVar9._0_8_;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = local_1f8;
      auVar132._8_8_ = 0;
      auVar132._0_8_ = local_1e8;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = local_200;
      auVar9 = vfmadd213sd_fma(auVar62,auVar132,auVar43);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_1c0;
      auVar144._8_8_ = 0;
      auVar144._0_8_ = local_1f0;
      auVar9 = vfnmadd213sd_fma(auVar144,auVar20,auVar9);
      auVar99._8_8_ = 0;
      auVar99._0_8_ = local_1d0;
      auVar126._8_8_ = 0;
      auVar126._0_8_ = local_1d8;
      auVar137._8_8_ = 0;
      auVar137._0_8_ = local_1d0 * local_1c8 * local_1c0;
      auVar9 = vfnmadd213sd_fma(auVar126,auVar137,auVar9);
      auVar9 = vfmadd213sd_fma(auVar144,auVar132,auVar9);
      auVar63._8_8_ = 0;
      auVar63._0_8_ = local_1b8;
      auVar81._8_8_ = 0;
      auVar81._0_8_ = local_1c0 * local_200;
      auVar9 = vfnmadd213sd_fma(auVar63,auVar81,auVar9);
      auVar138._8_8_ = 0;
      auVar138._0_8_ = auVar9._0_8_ + 2.0;
      auVar9 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar132,auVar138);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_1b8 * local_1c0 * local_1d8 * local_1c8;
      auVar9 = vfnmadd213sd_fma(auVar99,auVar21,auVar9);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_1e0;
      auVar9 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar22,auVar9);
      auVar9 = vfmadd213sd_fma(ZEXT816(0xc010000000000000),auVar63,auVar9);
      auVar82._8_8_ = 0;
      auVar82._0_8_ = local_1f8 + local_1f8;
      auVar9 = vfnmadd213sd_fma(auVar63,auVar82,auVar9);
      auVar9 = vfmadd213sd_fma(auVar22,auVar43,auVar9);
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1> *)
                          in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      *pSVar6 = auVar9._0_8_;
      auVar100._8_8_ = 0;
      auVar100._0_8_ = local_1d8;
      auVar64._8_8_ = 0;
      auVar64._0_8_ = local_1c8;
      auVar117._8_8_ = 0;
      auVar117._0_8_ = local_1c0;
      auVar108._8_8_ = 0;
      auVar108._0_8_ = local_1b8;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = local_1e8 * local_1d8;
      auVar83._8_8_ = 0;
      auVar83._0_8_ = local_1c0 * local_1d8 * local_1c8 * local_1b8;
      auVar9 = vfnmadd213sd_fma(auVar64,auVar44,auVar83);
      auVar45._8_8_ = 0;
      auVar45._0_8_ = local_1d0;
      auVar84._8_8_ = 0;
      auVar84._0_8_ = local_1e0 + local_1e0;
      auVar9 = vfnmadd213sd_fma(auVar45,auVar84,auVar9);
      auVar85._8_8_ = 0;
      auVar85._0_8_ = local_1d0 * local_1f0;
      auVar9 = vfmadd213sd_fma(auVar117,auVar85,auVar9);
      auVar139._8_8_ = 0;
      auVar139._0_8_ = (local_1c0 + local_1c0) * local_1d0;
      auVar9 = vfmadd213sd_fma(auVar108,auVar139,auVar9);
      auVar127._8_8_ = 0;
      auVar127._0_8_ = local_1b8 * 4.0;
      auVar9 = vfmadd213sd_fma(auVar45,auVar127,auVar9);
      auVar65._8_8_ = 0;
      auVar65._0_8_ = local_1c8 * local_1c0;
      auVar9 = vfmadd213sd_fma(auVar100,auVar65,auVar9);
      auVar86._8_8_ = 0;
      auVar86._0_8_ = local_1c0 + local_1c0;
      auVar9 = vfnmadd213sd_fma(auVar45,auVar86,auVar9);
      auVar9 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar45,auVar9);
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1> *)
                          in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      *pSVar6 = auVar9._0_8_;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_1b8;
      auVar9 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar23,ZEXT816(0x3ff0000000000000));
      auVar46._8_8_ = 0;
      auVar46._0_8_ = local_1c0;
      auVar9 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar46,auVar9);
      auVar66._8_8_ = 0;
      auVar66._0_8_ = local_1f0;
      auVar87._8_8_ = 0;
      auVar87._0_8_ = auVar9._0_8_ + local_1e8;
      auVar9 = vfnmadd213sd_fma(auVar66,auVar46,auVar87);
      auVar47._8_8_ = 0;
      auVar47._0_8_ = local_1c0 + local_1c0;
      auVar67._8_8_ = 0;
      auVar67._0_8_ = auVar9._0_8_ + local_1e0;
      auVar9 = vfnmadd213sd_fma(auVar23,auVar47,auVar67);
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1> *)
                          in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      *pSVar6 = auVar9._0_8_;
      Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,5,1,0,5,1>>
                ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffefe8,
                 (EigenBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_> *)
                 CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      math::o4_roots(in_stack_fffffffffffff800);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)0x7c5396);
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)0x7c53a3);
      for (local_2a8 = 0; local_2a8 < 4; local_2a8 = local_2a8 + 1) {
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](local_240,local_2a8);
        vVar1 = *pvVar7;
        pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                           (in_stack_ffffffffffffefe8,
                            CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
        *pSVar8 = vVar1;
      }
      auVar128._8_8_ = 0;
      auVar128._0_8_ = local_1f0;
      auVar68._8_8_ = 0;
      auVar68._0_8_ = local_1c8;
      auVar101._8_8_ = 0;
      auVar101._0_8_ = local_1b8 + -1.0 + local_1c0;
      auVar133._8_8_ = 0;
      auVar133._0_8_ = local_1c8 * local_1d0 * local_1d8;
      auVar9 = vfmadd213sd_fma(auVar101,auVar128,auVar133);
      auVar88._8_8_ = 0;
      auVar88._0_8_ = local_1d0 * local_1b8 * local_1d8;
      auVar9 = vfnmadd213sd_fma(auVar68,auVar88,auVar9);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_200;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = (local_1b8 + -1.0) - local_1c0;
      vfmadd213sd_fma(auVar24,auVar48,auVar9);
      dVar3 = local_200 * local_1d8;
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)0x7c5535);
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar13 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar2 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      *pSVar8 = dVar13 * dVar2;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar13 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar2 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      *pSVar8 = dVar13 * dVar2;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar13 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar2 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      *pSVar8 = dVar13 * dVar2;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar13 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar2 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      *pSVar8 = dVar13 * dVar2;
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)0x7c57c1);
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar13 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar2 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      *pSVar8 = dVar13 * dVar2;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar13 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar2 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      *pSVar8 = dVar13 * dVar2;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar13 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar2 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      *pSVar8 = dVar13 * dVar2;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar13 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar2 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      *pSVar8 = dVar13 * dVar2;
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)0x7c5a4d);
      for (local_328 = 0; local_328 < 4; local_328 = local_328 + 1) {
        pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                           (in_stack_ffffffffffffefe8,
                            CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
        *pSVar8 = 1.0;
      }
      Eigen::operator*((double *)in_stack_fffffffffffff030,in_stack_fffffffffffff028);
      auVar49._8_8_ = 0;
      auVar49._0_8_ = local_1d0;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_1b8;
      vfmsub213sd_fma(auVar25,auVar49,auVar49);
      Eigen::operator*((double *)in_stack_fffffffffffff030,in_stack_fffffffffffff028);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>>
      ::operator+((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
                   *)in_stack_fffffffffffff010,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
                   *)in_stack_fffffffffffff008);
      Eigen::operator*((double *)in_stack_fffffffffffff030,in_stack_fffffffffffff028);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>>
      ::operator+((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                   *)in_stack_fffffffffffff010,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
                   *)in_stack_fffffffffffff008);
      Eigen::Matrix<double,4,1,0,4,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>>
                ((Matrix<double,_4,_1,_0,_4,_1> *)in_stack_ffffffffffffefe8,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      auVar89._8_8_ = 0;
      auVar89._0_8_ = local_1e0;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = dVar3;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_1c0;
      auVar69._8_8_ = 0;
      auVar69._0_8_ = local_1b8;
      auVar102._8_8_ = 0;
      auVar102._0_8_ = (local_1c0 + local_1c0) * dVar3 * local_1b8;
      auVar9 = vfmadd213sd_fma(auVar50,auVar89,auVar102);
      auVar90._8_8_ = 0;
      auVar90._0_8_ = local_1c0 * local_200 * dVar3;
      auVar9 = vfnmadd213sd_fma(auVar69,auVar90,auVar9);
      auVar91._8_8_ = 0;
      auVar91._0_8_ = local_1b8 + local_1b8;
      auVar9 = vfnmadd213sd_fma(auVar50,auVar91,auVar9);
      auVar92._8_8_ = 0;
      auVar92._0_8_ = local_1e8;
      auVar103._8_8_ = 0;
      auVar103._0_8_ = auVar9._0_8_ + dVar3;
      auVar9 = vfmadd213sd_fma(auVar50,auVar92,auVar103);
      auVar51._8_8_ = 0;
      auVar51._0_8_ = dVar3 + dVar3;
      vfnmadd213sd_fma(auVar26,auVar51,auVar9);
      Eigen::operator*((double *)in_stack_fffffffffffff030,in_stack_fffffffffffff028);
      auVar70._8_8_ = 0;
      auVar70._0_8_ = local_1c8;
      auVar93._8_8_ = 0;
      auVar93._0_8_ = local_200;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_1e0 * local_1c8 * local_200;
      auVar9 = vfmadd213sd_fma(auVar93,auVar70,auVar27);
      auVar118._8_8_ = 0;
      auVar118._0_8_ = local_1c0;
      auVar109._8_8_ = 0;
      auVar109._0_8_ = local_1d0;
      auVar104._8_8_ = 0;
      auVar104._0_8_ = local_1b8;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = dVar3 * (local_1c0 + local_1c0) * local_1d0;
      auVar9 = vfnmadd213sd_fma(auVar104,auVar28,auVar9);
      dVar13 = dVar3 + dVar3;
      auVar129._8_8_ = 0;
      auVar129._0_8_ = dVar13 * local_1c0;
      auVar9 = vfmadd213sd_fma(auVar109,auVar129,auVar9);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = dVar13;
      auVar9 = vfnmadd213sd_fma(auVar109,auVar29,auVar9);
      auVar52._8_8_ = 0;
      auVar52._0_8_ = (local_1c8 + local_1c8) * (local_1b8 + local_1c0);
      auVar9 = vfnmadd213sd_fma(auVar93,auVar52,auVar9);
      auVar53._8_8_ = 0;
      auVar53._0_8_ = local_200 * local_200 * local_1c8;
      auVar9 = vfmadd213sd_fma(auVar118,auVar53,auVar9);
      auVar130._8_8_ = 0;
      auVar130._0_8_ = dVar3 * local_1b8 * 4.0;
      auVar9 = vfmadd213sd_fma(auVar109,auVar130,auVar9);
      auVar140._8_8_ = 0;
      auVar140._0_8_ = dVar3 * local_1c0 * local_1d0 * local_1b8;
      auVar9 = vfmadd213sd_fma(auVar93,auVar140,auVar9);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_1e0 * dVar13;
      auVar9 = vfnmadd213sd_fma(auVar109,auVar30,auVar9);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = (local_200 + local_200) * local_1c8 * local_1c0;
      auVar9 = vfmadd213sd_fma(auVar104,auVar31,auVar9);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = local_1e8;
      auVar94._8_8_ = 0;
      auVar94._0_8_ = local_1e8 * local_200;
      auVar9 = vfmadd213sd_fma(auVar70,auVar94,auVar9);
      vfnmadd213sd_fma(auVar32,auVar53,auVar9);
      Eigen::operator*((double *)in_stack_fffffffffffff030,in_stack_fffffffffffff028);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>>
      ::operator+((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
                   *)in_stack_fffffffffffff010,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
                   *)in_stack_fffffffffffff008);
      auVar71._8_8_ = 0;
      auVar71._0_8_ = dVar3;
      auVar95._8_8_ = 0;
      auVar95._0_8_ = local_1f8;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = local_200;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = local_1e8;
      auVar110._8_8_ = 0;
      auVar110._0_8_ = local_200 * dVar3 * local_1e8;
      auVar9 = vfmadd213sd_fma(auVar95,auVar71,auVar110);
      auVar119._8_8_ = 0;
      auVar119._0_8_ = local_1d8;
      auVar134._8_8_ = 0;
      auVar134._0_8_ = local_1f0;
      auVar131._8_8_ = 0;
      auVar131._0_8_ = local_1f0 * local_1d8;
      auVar9 = vfmadd213sd_fma(auVar33,auVar131,auVar9);
      auVar145._8_8_ = 0;
      auVar145._0_8_ = local_1b8;
      auVar111._8_8_ = 0;
      auVar111._0_8_ = local_1b8 * 4.0;
      auVar9 = vfnmadd213sd_fma(auVar71,auVar111,auVar9);
      dVar13 = local_1b8 + local_1b8;
      auVar112._8_8_ = 0;
      auVar112._0_8_ = dVar13 * dVar3;
      auVar9 = vfnmadd213sd_fma(auVar95,auVar112,auVar9);
      auVar113._8_8_ = 0;
      auVar113._0_8_ = local_1e0;
      auVar96._8_8_ = 0;
      auVar96._0_8_ = dVar3 * local_1f8;
      auVar9 = vfmadd213sd_fma(auVar113,auVar96,auVar9);
      auVar141._8_8_ = 0;
      auVar141._0_8_ = local_1e0 + local_1e0;
      auVar9 = vfmadd213sd_fma(auVar71,auVar141,auVar9);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = local_1e8 + local_1e8;
      auVar9 = vfnmadd213sd_fma(auVar71,auVar34,auVar9);
      auVar97._8_8_ = 0;
      auVar97._0_8_ = local_1c0;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = (local_1f0 + local_1f0) * local_1c0;
      auVar9 = vfnmadd213sd_fma(auVar119,auVar35,auVar9);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = local_1c8;
      auVar105._8_8_ = 0;
      auVar105._0_8_ = local_1d0;
      auVar151._8_8_ = 0;
      auVar151._0_8_ = local_1b8 * local_1c8 * 4.0 * local_200;
      auVar9 = vfmadd213sd_fma(auVar105,auVar151,auVar9);
      auVar152._8_8_ = 0;
      auVar152._0_8_ = dVar13 * local_1f0 * local_1d8;
      auVar9 = vfmadd213sd_fma(auVar97,auVar152,auVar9);
      auVar147._8_8_ = 0;
      auVar147._0_8_ = dVar13 * local_200 * local_1d0 * local_1c0;
      auVar9 = vfnmadd213sd_fma(auVar36,auVar147,auVar9);
      auVar148._8_8_ = 0;
      auVar148._0_8_ = (local_1f0 + local_1f0) * local_1b8;
      auVar9 = vfnmadd213sd_fma(auVar119,auVar148,auVar9);
      auVar9 = vfmadd213sd_fma(auVar134,auVar119,auVar9);
      auVar120._8_8_ = 0;
      auVar120._0_8_ = local_1c0 * local_200 * dVar3;
      auVar9 = vfnmadd213sd_fma(auVar145,auVar120,auVar9);
      auVar135._8_8_ = 0;
      auVar135._0_8_ = (local_1c8 + local_1c8) * local_200 * local_1c0;
      auVar9 = vfmadd213sd_fma(auVar105,auVar135,auVar9);
      auVar9 = vfmadd213sd_fma(auVar113,auVar131,auVar9);
      auVar121._8_8_ = 0;
      auVar121._0_8_ = (local_1c8 + local_1c8) * local_1d0;
      auVar9 = vfnmadd213sd_fma(auVar54,auVar121,auVar9);
      auVar9 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar71,auVar9);
      auVar114._8_8_ = 0;
      auVar114._0_8_ = (local_200 + local_200) * local_1c8 * local_1e0;
      auVar9 = vfnmadd213sd_fma(auVar105,auVar114,auVar9);
      auVar55._8_8_ = 0;
      auVar55._0_8_ = local_200 * local_200 * local_1d0 * local_1c0;
      vfnmadd213sd_fma(auVar36,auVar55,auVar9);
      Eigen::operator*((double *)in_stack_fffffffffffff030,in_stack_fffffffffffff028);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>>
      ::operator+((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                   *)in_stack_fffffffffffff010,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
                   *)in_stack_fffffffffffff008);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = local_1b8;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = local_1b8 * 4.0;
      auVar158._8_8_ = 0;
      auVar158._0_8_ = dVar3;
      auVar9 = vmulsd_avx512f(auVar56,auVar158);
      auVar98._8_8_ = 0;
      auVar98._0_8_ = local_1d0;
      auVar142._8_8_ = 0;
      auVar142._0_8_ = local_1c8;
      auVar153._8_8_ = 0;
      auVar153._0_8_ = local_200;
      auVar146._8_8_ = 0;
      auVar146._0_8_ = local_1f8;
      auVar72._8_8_ = 0;
      auVar72._0_8_ = local_1f8 * local_1c8 * local_200;
      auVar9 = vfmadd213sd_fma(auVar98,auVar9,auVar72);
      auVar155._8_8_ = 0;
      auVar155._0_8_ = local_1f0;
      dVar13 = local_1f0 + local_1f0;
      auVar115._8_8_ = 0;
      auVar115._0_8_ = local_1c0;
      auVar73._8_8_ = 0;
      auVar73._0_8_ = local_1c8 * dVar13 * local_1c0;
      auVar9 = vfmadd213sd_fma(auVar37,auVar73,auVar9);
      auVar74._8_8_ = 0;
      auVar74._0_8_ = local_1c8 * 4.0 * local_1b8;
      auVar9 = vfnmadd213sd_fma(auVar153,auVar74,auVar9);
      auVar159._8_8_ = 0;
      auVar159._0_8_ = dVar3;
      auVar10 = vaddsd_avx512f(auVar158,auVar159);
      auVar75._8_8_ = 0;
      auVar75._0_8_ = auVar10._0_8_ * local_1c0;
      auVar9 = vfnmadd213sd_fma(auVar98,auVar75,auVar9);
      auVar106._8_8_ = 0;
      auVar106._0_8_ = local_1d8;
      auVar76._8_8_ = 0;
      auVar76._0_8_ = dVar13 * local_1d0;
      auVar9 = vfnmadd213sd_fma(auVar106,auVar76,auVar9);
      auVar77._8_8_ = 0;
      auVar77._0_8_ = local_1e8;
      auVar122._8_8_ = 0;
      auVar122._0_8_ = local_200 * (local_1e8 + local_1e8);
      auVar9 = vfnmadd213sd_fma(auVar142,auVar122,auVar9);
      auVar123._8_8_ = 0;
      auVar123._0_8_ = local_1c8 * local_200 * local_200;
      auVar9 = vfmadd213sd_avx512f(auVar115,auVar123,auVar9);
      dVar2 = local_1c8 + local_1c8;
      auVar154._8_8_ = 0;
      auVar154._0_8_ = local_1e0;
      auVar124._8_8_ = 0;
      auVar124._0_8_ = dVar2 * local_1e0;
      auVar9 = vfmadd213sd_avx512f(auVar153,auVar124,auVar9);
      auVar11 = vmulsd_avx512f(auVar10,auVar154);
      auVar9 = vfnmadd213sd_avx512f(auVar98,auVar11,auVar9);
      auVar136._8_8_ = 0;
      auVar136._0_8_ = local_1c8 * dVar13;
      auVar9 = vfnmadd213sd_avx512f(auVar37,auVar136,auVar9);
      auVar125._8_8_ = 0;
      auVar125._0_8_ = local_1f0 * local_1c8;
      auVar9 = vfmadd213sd_avx512f(auVar154,auVar125,auVar9);
      auVar149._8_8_ = 0;
      auVar149._0_8_ = dVar2;
      auVar9 = vfmadd213sd_avx512f(auVar153,auVar149,auVar9);
      auVar9 = vfmadd213sd_avx512f(auVar142,auVar155,auVar9);
      auVar11 = vaddsd_avx512f(auVar115,auVar115);
      auVar11 = vmulsd_avx512f(auVar11,auVar159);
      auVar11 = vmulsd_avx512f(auVar11,auVar98);
      auVar9 = vfmadd213sd_avx512f(auVar37,auVar11,auVar9);
      auVar11 = vaddsd_avx512f(auVar98,auVar98);
      auVar11 = vmulsd_avx512f(auVar11,auVar155);
      auVar11 = vmulsd_avx512f(auVar11,auVar115);
      auVar9 = vfmadd213sd_avx512f(auVar106,auVar11,auVar9);
      auVar157._8_8_ = 0;
      auVar157._0_8_ = local_1d0 * 4.0 * local_1b8 * local_1d8;
      auVar9 = vfmadd213sd_avx512f(auVar155,auVar157,auVar9);
      auVar150._8_8_ = 0;
      auVar150._0_8_ = dVar2 * local_1b8 * local_200;
      auVar9 = vfnmadd213sd_fma(auVar146,auVar150,auVar9);
      auVar156._8_8_ = 0;
      auVar156._0_8_ = local_1e0 * dVar13 * local_1d8;
      auVar9 = vfnmadd213sd_fma(auVar98,auVar156,auVar9);
      auVar143._8_8_ = 0;
      auVar143._0_8_ = local_1c8 * local_1e0 * local_200;
      auVar9 = vfmadd213sd_fma(auVar146,auVar143,auVar9);
      auVar9 = vfnmadd213sd_fma(auVar98,auVar10,auVar9);
      auVar9 = vfnmadd213sd_fma(auVar115,auVar136,auVar9);
      auVar9 = vfmadd213sd_fma(auVar77,auVar125,auVar9);
      auVar57._8_8_ = 0;
      auVar57._0_8_ = dVar13 * local_1c0 * local_1d8 * local_1d0;
      vfnmadd213sd_fma(auVar37,auVar57,auVar9);
      Eigen::operator*((double *)in_stack_fffffffffffff030,in_stack_fffffffffffff028);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>>
      ::operator+((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                   *)in_stack_fffffffffffff010,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
                   *)in_stack_fffffffffffff008);
      Eigen::Matrix<double,4,1,0,4,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>>
                ((Matrix<double,_4,_1,_0,_4,_1> *)in_stack_ffffffffffffefe8,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)0x7c6249);
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar13 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar2 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      *pSVar8 = dVar13 * dVar2;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar13 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar2 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      *pSVar8 = dVar13 * dVar2;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar13 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar2 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      *pSVar8 = dVar13 * dVar2;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar13 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar2 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      *pSVar8 = dVar13 * dVar2;
      Eigen::MatrixBase<Eigen::Matrix<double,4,1,0,4,1>>::operator/
                (in_stack_fffffffffffff030,(double *)in_stack_fffffffffffff028);
      Eigen::Matrix<double,4,1,0,4,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,4,1,0,4,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const>>
                ((Matrix<double,_4,_1,_0,_4,_1> *)in_stack_ffffffffffffefe8,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)0x7c650b);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                (in_stack_ffffffffffffefe8,
                 CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      _Var12 = std::pow<double,int>((double)in_stack_ffffffffffffefe8,in_stack_ffffffffffffefe4);
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      *pSVar8 = _Var12;
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                (in_stack_ffffffffffffefe8,
                 CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      p1 = (pointer)std::pow<double,int>
                              ((double)in_stack_ffffffffffffefe8,in_stack_ffffffffffffefe4);
      p2 = (points_t *)
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (in_stack_ffffffffffffefe8,
                      CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      (p2->
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      )._M_impl.super__Vector_impl_data._M_start = p1;
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                (in_stack_ffffffffffffefe8,
                 CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      _Var12 = std::pow<double,int>((double)in_stack_ffffffffffffefe8,in_stack_ffffffffffffefe4);
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      *pSVar8 = _Var12;
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                (in_stack_ffffffffffffefe8,
                 CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      _Var12 = std::pow<double,int>((double)in_stack_ffffffffffffefe8,in_stack_ffffffffffffefe4);
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      *pSVar8 = _Var12;
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)0x7c66d0);
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar13 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar2 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      *pSVar8 = dVar13 * dVar2;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar13 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar2 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      *pSVar8 = dVar13 * dVar2;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar13 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar2 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      *pSVar8 = dVar13 * dVar2;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar13 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar2 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      *pSVar8 = dVar13 * dVar2;
      Eigen::MatrixBase<Eigen::Matrix<double,4,1,0,4,1>>::operator+
                ((MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)in_stack_fffffffffffff010,
                 (MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)in_stack_fffffffffffff008);
      Eigen::operator*((double *)in_stack_fffffffffffff030,in_stack_fffffffffffff028);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,4,1,0,4,1>const,Eigen::Matrix<double,4,1,0,4,1>const>>
      ::operator-((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
                   *)in_stack_fffffffffffff010,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
                   *)in_stack_fffffffffffff008);
      Eigen::Matrix<double,4,1,0,4,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,4,1,0,4,1>const,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>>
                ((Matrix<double,_4,_1,_0,_4,_1> *)in_stack_ffffffffffffefe8,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)0x7c69d0);
      RVar4 = local_c8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar13 = sqrt(*pSVar8);
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      RVar5 = local_c8;
      *pSVar8 = RVar4 / dVar13;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar13 = sqrt(*pSVar8);
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      RVar4 = local_c8;
      *pSVar8 = RVar5 / dVar13;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar13 = sqrt(*pSVar8);
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      RVar5 = local_c8;
      *pSVar8 = RVar4 / dVar13;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar13 = sqrt(*pSVar8);
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      *pSVar8 = RVar5 / dVar13;
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)0x7c6c05);
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar13 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar2 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      *pSVar8 = dVar13 * dVar2;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar13 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar2 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      *pSVar8 = dVar13 * dVar2;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar13 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar2 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      *pSVar8 = dVar13 * dVar2;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar13 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar2 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      *pSVar8 = dVar13 * dVar2;
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)0x7c6e91);
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar13 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar2 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      *pSVar8 = dVar13 * dVar2;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar13 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar2 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      *pSVar8 = dVar13 * dVar2;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar13 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      scalar = (double *)(dVar13 * *pSVar8);
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      *pSVar8 = (Scalar)scalar;
      matrix = (StorageBaseType *)
               Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      SVar160 = *(Scalar *)matrix;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      dVar13 = SVar160 * *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_ffffffffffffefe8,
                          CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      *pSVar8 = dVar13;
      for (local_984 = 0; local_984 < 4; local_984 = local_984 + 1) {
        std::
        vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)0x7c70f4);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                  (in_stack_ffffffffffffefe8,
                   CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
        Eigen::operator*(scalar,matrix);
        Eigen::Matrix<double,3,1,0,3,1>::
        Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                  ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffffefe8,
                   (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    *)CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
        std::
        vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::push_back((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     *)in_stack_ffffffffffffefe8,
                    (value_type *)CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
        in_stack_ffffffffffffeff8 =
             (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                          (in_stack_ffffffffffffefe8,
                           CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
        Eigen::operator*(scalar,matrix);
        Eigen::Matrix<double,3,1,0,3,1>::
        Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                  ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffffefe8,
                   (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    *)CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
        std::
        vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::push_back((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     *)in_stack_ffffffffffffefe8,
                    (value_type *)CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
        __x = (value_type *)
              Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                        (in_stack_ffffffffffffefe8,
                         CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
        Eigen::operator*(scalar,matrix);
        Eigen::Matrix<double,3,1,0,3,1>::
        Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                  ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffffefe8,
                   (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    *)CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
        std::
        vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::push_back((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     *)in_stack_ffffffffffffefe8,
                    (value_type *)CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
        math::arun_complete((points_t *)p1,p2);
        std::
        vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
        ::push_back((vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
                     *)in_stack_ffffffffffffeff8,__x);
        std::
        vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::~vector(in_stack_ffffffffffffeff8);
      }
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffeff8);
    }
  }
  return;
}

Assistant:

void
opengv::absolute_pose::modules::p3p_gao_main(
    const bearingVectors_t & f,
    const points_t & points,
    transformations_t & solutions )
{
  point_t A = points[0];
  point_t B = points[1];
  point_t C = points[2];

  Eigen::Vector3d tempp;
  tempp = A-B;
  double AB = tempp.norm();
  tempp = B-C;
  double BC = tempp.norm();
  tempp = A-C;
  double AC = tempp.norm();

  bearingVector_t f1 = f[0];
  bearingVector_t f2 = f[1];
  bearingVector_t f3 = f[2];

  double cosalpha = f2.transpose()*f3;
  double cosbeta = f1.transpose()*f3;
  double cosgamma = f1.transpose()*f2;

  double a=pow((BC/AB),2);
  double b=pow((AC/AB),2);
  double p=2*cosalpha;
  double q=2*cosbeta;
  double r=2*cosgamma;

  double aSq = a * a;
  double bSq = b * b;
  double pSq = p*p;
  double qSq = q*q;
  double rSq = r*r;

  if ((pSq + qSq + rSq - p*q*r - 1) == 0)
    return;

  Eigen::Matrix<double,5,1> factors;

  factors[0] = -2*b + bSq + aSq + 1 - b*rSq*a + 2*b*a - 2*a;

  if (factors[0] == 0)
    return;

  factors[1] =
      -2*b*q*a - 2*aSq*q + b*rSq*q*a - 2*q + 2*b*q +
      4*a*q + p*b*r + b*r*p*a - bSq*r*p;
  factors[2] =
      qSq + bSq*rSq - b*pSq - q*p*b*r + bSq*pSq - b*rSq*a +
      2 - 2*bSq - a*b*r*p*q + 2*aSq - 4*a - 2*qSq*a + qSq*aSq;
  factors[3] =
      -bSq*r*p + b*r*p*a - 2*aSq*q + q*pSq*b +
      2*b*q*a + 4*a*q + p*b*r - 2*b*q - 2*q;
  factors[4] = 1 - 2*a + 2*b + bSq - b*pSq + aSq - 2*b*a;

  std::vector<double> x_temp = math::o4_roots(factors);
  Eigen::Matrix<double,4,1> x;
  for( size_t i = 0; i < 4; i++ ) x[i] = x_temp[i];

  double temp = (pSq*(a-1+b) + p*q*r - q*a*r*p + (a-1-b)*rSq);
  double b0 = b * temp * temp;

  double rCb = rSq*r;

  Eigen::Matrix<double,4,1> tempXP2;
  tempXP2[0] = x[0]*x[0];
  tempXP2[1] = x[1]*x[1];
  tempXP2[2] = x[2]*x[2];
  tempXP2[3] = x[3]*x[3];
  Eigen::Matrix<double,4,1> tempXP3;
  tempXP3[0] = tempXP2[0]*x[0];
  tempXP3[1] = tempXP2[1]*x[1];
  tempXP3[2] = tempXP2[2]*x[2];
  tempXP3[3] = tempXP2[3]*x[3];

  Eigen::Matrix<double,4,1> ones;
  for( size_t i = 0; i < 4; i++) ones[i] = 1.0;

  Eigen::Matrix<double,4,1> b1_part1 =
      (1-a-b)*tempXP2 + (q*a-q)*x + (1 - a + b)*ones;

  Eigen::Matrix<double,4,1> b1_part2 =
      (aSq*rCb + 2*b*rCb*a - b*rSq*rCb*a - 2*a*rCb + rCb + bSq*rCb
      - 2*rCb*b)*tempXP3
      +(p*rSq + p*aSq*rSq - 2*b*rCb*q*a + 2*rCb*b*q - 2*rCb*q - 2*p*(a+b)*rSq
      + rSq*rSq*p*b + 4*a*rCb*q + b*q*a*rCb*rSq - 2*rCb*aSq*q +2*rSq*p*b*a
      + bSq*rSq*p - rSq*rSq*p*bSq)*tempXP2
      +(rCb*qSq + rSq*rCb*bSq + r*pSq*bSq - 4*a*rCb - 2*a*rCb*qSq + rCb*qSq*aSq
      + 2*aSq*rCb - 2*bSq*rCb - 2*pSq*b*r + 4*p*a*rSq*q + 2*a*pSq*r*b
      - 2*a*rSq*q*b*p - 2*pSq*a*r + r*pSq - b*rSq*rCb*a + 2*p*rSq*b*q
      + r*pSq*aSq -2*p*q*rSq + 2*rCb - 2*rSq*p*aSq*q - rSq*rSq*q*b*p)*x
      +(4*a*rCb*q + p*rSq*qSq + 2*pSq*p*b*a - 4*p*a*rSq - 2*rCb*b*q - 2*pSq*q*r
      - 2*bSq*rSq*p + rSq*rSq*p*b + 2*p*aSq*rSq - 2*rCb*aSq*q - 2*pSq*p*a
      + pSq*p*aSq + 2*p*rSq + pSq*p + 2*b*rCb*q*a + 2*q*pSq*b*r + 4*q*a*r*pSq
      - 2*p*a*rSq*qSq - 2*pSq*aSq*r*q + p*aSq*rSq*qSq - 2*rCb*q - 2*pSq*p*b
      + pSq*p*bSq - 2*pSq*b*r*q*a)*ones;

  Eigen::Matrix<double,4,1> b1;
  b1[0] = b1_part1[0]*b1_part2[0];
  b1[1] = b1_part1[1]*b1_part2[1];
  b1[2] = b1_part1[2]*b1_part2[2];
  b1[3] = b1_part1[3]*b1_part2[3];

  Eigen::Matrix<double,4,1> y=b1/b0;
  Eigen::Matrix<double,4,1> tempYP2;
  tempYP2[0] = pow(y[0],2);
  tempYP2[1] = pow(y[1],2);
  tempYP2[2] = pow(y[2],2);
  tempYP2[3] = pow(y[3],2);

  Eigen::Matrix<double,4,1> tempXY;
  tempXY[0] = x[0]*y[0];
  tempXY[1] = x[1]*y[1];
  tempXY[2] = x[2]*y[2];
  tempXY[3] = x[3]*y[3];

  Eigen::Matrix<double,4,1> v= tempXP2 + tempYP2 - r*tempXY;

  Eigen::Matrix<double,4,1> Z;
  Z[0] = AB/sqrt(v[0]);
  Z[1] = AB/sqrt(v[1]);
  Z[2] = AB/sqrt(v[2]);
  Z[3] = AB/sqrt(v[3]);

  Eigen::Matrix<double,4,1> X;
  X[0] = x[0]*Z[0];
  X[1] = x[1]*Z[1];
  X[2] = x[2]*Z[2];
  X[3] = x[3]*Z[3];

  Eigen::Matrix<double,4,1> Y;
  Y[0] = y[0]*Z[0];
  Y[1] = y[1]*Z[1];
  Y[2] = y[2]*Z[2];
  Y[3] = y[3]*Z[3];

  for( int i = 0; i < 4; i++ )
  {
    //apply arun to find the transformation
    points_t p_cam;
    p_cam.push_back(X[i]*f1);
    p_cam.push_back(Y[i]*f2);
    p_cam.push_back(Z[i]*f3);

    transformation_t solution = math::arun_complete(points,p_cam);
    solutions.push_back(solution);
  }
}